

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void GlobOpt::TrackByteCodeSymUsed
               (Instr *instr,BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed,
               PropertySym **pPropertySym)

{
  PropertySym *pPVar1;
  Opnd *this;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  StackSym *pSVar4;
  undefined4 *puVar5;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (!bVar3) {
    if (instr->m_src1 != (Opnd *)0x0) {
      TrackByteCodeSymUsed(instr->m_src1,instrByteCodeStackSymUsed,pPropertySym);
      if (instr->m_src2 != (Opnd *)0x0) {
        TrackByteCodeSymUsed(instr->m_src2,instrByteCodeStackSymUsed,pPropertySym);
      }
    }
    pPVar1 = *pPropertySym;
    this = instr->m_dst;
    if (this != (Opnd *)0x0) {
      pSVar4 = IR::Opnd::GetStackSym(this);
      if (pSVar4 == (StackSym *)0x0) {
        TrackByteCodeSymUsed(this,instrByteCodeStackSymUsed,pPropertySym);
      }
    }
    if ((pPVar1 != (PropertySym *)0x0) && (pPVar1 != *pPropertySym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x15a,
                         "(propertySymFromSrc == __null || propertySymFromSrc == *pPropertySym)",
                         "Lost a property sym use?");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackByteCodeSymUsed(IR::Instr * instr, BVSparse<JitArenaAllocator> * instrByteCodeStackSymUsed, PropertySym **pPropertySym)
{
    if(instr->m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return;
    }
    IR::Opnd * src = instr->GetSrc1();
    if (src)
    {
        TrackByteCodeSymUsed(src, instrByteCodeStackSymUsed, pPropertySym);
        src = instr->GetSrc2();
        if (src)
        {
            TrackByteCodeSymUsed(src, instrByteCodeStackSymUsed, pPropertySym);
        }
    }

#if DBG
    // There should be no more than one property sym used.
    PropertySym *propertySymFromSrc = *pPropertySym;
#endif

    IR::Opnd * dst = instr->GetDst();
    if (dst)
    {
        StackSym *stackSym = dst->GetStackSym();

        // We want stackSym uses: IndirOpnd and SymOpnds of propertySyms.
        // RegOpnd and SymOPnd of StackSyms are stack sym defs.
        if (stackSym == NULL)
        {
            TrackByteCodeSymUsed(dst, instrByteCodeStackSymUsed, pPropertySym);
        }
    }

#if DBG
    AssertMsg(propertySymFromSrc == NULL || propertySymFromSrc == *pPropertySym,
              "Lost a property sym use?");
#endif
}